

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O1

VRle operator-(VRect *rect,VRle *o)

{
  pointer pSVar1;
  Data *this;
  Data *this_00;
  size_t in_RCX;
  long *in_RDX;
  void *__buf;
  int __fd;
  
  if ((*(int *)&(o->d).mModel < *(int *)&o[1].d.mModel) &&
     (*(int *)((long)&(o->d).mModel + 4) < *(int *)((long)&o[1].d.mModel + 4))) {
    this = (Data *)__tls_get_addr(&PTR_00145f70);
    if (*(char *)&this[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_start == '\0') {
      operator-();
    }
    pSVar1 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar1) {
      (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar1;
    }
    *(undefined8 *)((long)&(this->mBbox).x1 + 1) = 0;
    *(undefined8 *)((long)&(this->mBbox).x2 + 1) = 0;
    (this->mOffset).mx = 0;
    (this->mOffset).my = 0;
    (this->mBbox).x1 = 0;
    (this->mBbox).y1 = 0;
    if (*(char *)&this[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_start == '\0') {
      operator-();
    }
    VRle::Data::addRect(this,(VRect *)o);
    __fd = (int)o;
    vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)rect);
    this_00 = (Data *)vcow_ptr<VRle::Data>::write((vcow_ptr<VRle::Data> *)rect,__fd,__buf,in_RCX);
    if (*(char *)&this[1].mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_start == '\0') {
      operator-();
    }
    VRle::Data::opSubstract(this_00,this,(Data *)(*in_RDX + 8));
  }
  else {
    rect->x1 = 0;
    rect->y1 = 0;
    vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)rect);
  }
  return (VRle)(vcow_ptr<VRle::Data>)rect;
}

Assistant:

VRle operator-(const VRect &rect, const VRle &o)
{
    if (rect.empty()) return {};

    Scratch_Object.reset();
    Scratch_Object.addRect(rect);

    VRle result;
    result.d.write().opSubstract(Scratch_Object, o.d.read());

    return result;
}